

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

ReferenceCounterValueType __thiscall
Diligent::
DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::Release
          (DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           *this)

{
  ReferenceCounterValueType RVar1;
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl> pDevice;
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl> local_20;
  anon_class_16_2_6cb51993 local_18;
  
  local_18.pDevice = &local_20;
  local_20.m_pObject = (RenderDeviceGLImpl *)0x0;
  local_18.this = this;
  RVar1 = RefCountedObject<Diligent::ITextureGL>::
          Release<Diligent::DeviceObjectBase<Diligent::ITextureGL,Diligent::RenderDeviceGLImpl,Diligent::TextureDesc>::Release()::_lambda()_1_>
                    ((RefCountedObject<Diligent::ITextureGL> *)this,&local_18);
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::Release(&local_20);
  return RVar1;
}

Assistant:

Release() override final
    {
        // Render device owns allocators for all types of device objects,
        // so it must be destroyed after all device objects are released.
        // Consider the following scenario: an object A owns the last strong
        // reference to the device:
        //
        // 1. A::~A() completes
        // 2. A::~DeviceObjectBase() completes
        // 3. A::m_pDevice is released
        //       Render device is destroyed, all allocators are invalid
        // 4. RefCountersImpl::ObjectWrapperBase::DestroyObject() calls
        //    m_pAllocator->Free(m_pObject) - crash!

        RefCntAutoPtr<RenderDeviceImplType> pDevice;
        return TBase::Release(
            [&]() //
            {
                // We must keep the device alive while the object is being destroyed
                // Note that internal device objects do not keep strong reference to the device
                if (!m_bIsDeviceInternal)
                {
                    pDevice = m_pDevice;
                }
            });
    }